

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&>
          (polymorphic_allocator<std::byte> *this,TriangleMesh *p,Transform *args,bool *args_1,
          vector<int,_std::allocator<int>_> *args_2,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_3,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *args_4,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args_5,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_6,
          vector<int,_std::allocator<int>_> *args_7)

{
  bool reverseOrientation;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  undefined8 uVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  undefined8 in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  pointer local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_60;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_48;
  
  reverseOrientation = *args_1;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,args_2);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             &stack0xffffffffffffff58,args_3);
  pVVar2 = (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
            (&local_48,args_5);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector(&local_60,args_6);
  uVar1 = 0x201c9f;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,args_7);
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_60;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_48;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_78;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVVar2;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)uVar1;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pVVar3;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffff50;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pVVar4;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffff58;
  pbrt::TriangleMesh::TriangleMesh
            (p,args,reverseOrientation,&local_90,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             &stack0xffffffffffffff58,
             (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
             &stack0xffffffffffffff38,n,uv,faceIndices);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)pVVar4 - (long)pVVar2);
  }
  if (in_stack_ffffffffffffff58 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffff58,(long)local_98 - (long)in_stack_ffffffffffffff58);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }